

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_once.h
# Opt level: O0

void absl::lts_20250127::base_internal::
     CallOnceImpl<absl::lts_20250127::base_internal::NumCPUs()::__0>
               (Nonnull<std::atomic<uint32_t>_*> control,SchedulingMode scheduling_mode,
               anon_class_1_0_00000001 *fn)

{
  __int_type_conflict3 _Var1;
  uint uVar2;
  memory_order mVar3;
  uint32_t uVar4;
  uint32_t old_control;
  SchedulingHelper maybe_disable_scheduling;
  char *absl_raw_log_internal_basename;
  uint32_t old_control_1;
  anon_class_1_0_00000001 *fn_local;
  SchedulingMode scheduling_mode_local;
  Nonnull<std::atomic<uint32_t>_*> control_local;
  memory_order __b;
  bool local_29;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar2 = (control->super___atomic_base<unsigned_int>)._M_i;
  if ((((uVar2 != 0) && (uVar2 != 0x65c2937b)) && (uVar2 != 0x5a308d2)) && (uVar2 != 0xdd)) {
    maybe_disable_scheduling =
         (SchedulingHelper)
         ((long)
          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/call_once.h"
         + 0x6f);
    raw_log_internal::RawLog
              (kFatal,"call_once.h",0xa4,"Unexpected value for control word: 0x%lx",(ulong)uVar2);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/call_once.h"
                  ,0xa4,
                  "void absl::base_internal::CallOnceImpl(absl::Nonnull<std::atomic<uint32_t> *>, base_internal::SchedulingMode, Callable &&, Args &&...) [Callable = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/sysinfo.cc:371:28), Args = <>]"
                 );
  }
  SchedulingHelper::SchedulingHelper((SchedulingHelper *)&stack0xffffffffffffff58,scheduling_mode);
  mVar3 = std::__cmpexch_failure_order(memory_order_relaxed);
  if (mVar3 - memory_order_consume < 2) {
    LOCK();
    local_29 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
    if (local_29) {
      (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
    }
    UNLOCK();
  }
  else if (mVar3 == memory_order_seq_cst) {
    LOCK();
    local_29 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
    if (local_29) {
      (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
    }
    UNLOCK();
  }
  else {
    LOCK();
    local_29 = (control->super___atomic_base<unsigned_int>)._M_i == 0;
    if (local_29) {
      (control->super___atomic_base<unsigned_int>)._M_i = 0x65c2937b;
    }
    UNLOCK();
  }
  if ((local_29) ||
     (uVar4 = SpinLockWait(control,3,
                           CallOnceImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/sysinfo.cc:371:28)>
                           ::trans,scheduling_mode), uVar4 == 0)) {
    std::invoke<absl::lts_20250127::base_internal::NumCPUs()::__0>(fn);
    LOCK();
    _Var1 = (control->super___atomic_base<unsigned_int>)._M_i;
    (control->super___atomic_base<unsigned_int>)._M_i = 0xdd;
    UNLOCK();
    if (_Var1 == 0x5a308d2) {
      SpinLockWake(control,true);
    }
  }
  SchedulingHelper::~SchedulingHelper((SchedulingHelper *)&stack0xffffffffffffff58);
  return;
}

Assistant:

void
    CallOnceImpl(absl::Nonnull<std::atomic<uint32_t>*> control,
                 base_internal::SchedulingMode scheduling_mode, Callable&& fn,
                 Args&&... args) {
#ifndef NDEBUG
  {
    uint32_t old_control = control->load(std::memory_order_relaxed);
    if (old_control != kOnceInit &&
        old_control != kOnceRunning &&
        old_control != kOnceWaiter &&
        old_control != kOnceDone) {
      ABSL_RAW_LOG(FATAL, "Unexpected value for control word: 0x%lx",
                   static_cast<unsigned long>(old_control));  // NOLINT
    }
  }
#endif  // NDEBUG
  static const base_internal::SpinLockWaitTransition trans[] = {
      {kOnceInit, kOnceRunning, true},
      {kOnceRunning, kOnceWaiter, false},
      {kOnceDone, kOnceDone, true}};

  // Must do this before potentially modifying control word's state.
  base_internal::SchedulingHelper maybe_disable_scheduling(scheduling_mode);
  // Short circuit the simplest case to avoid procedure call overhead.
  // The base_internal::SpinLockWait() call returns either kOnceInit or
  // kOnceDone. If it returns kOnceDone, it must have loaded the control word
  // with std::memory_order_acquire and seen a value of kOnceDone.
  uint32_t old_control = kOnceInit;
  if (control->compare_exchange_strong(old_control, kOnceRunning,
                                       std::memory_order_relaxed) ||
      base_internal::SpinLockWait(control, ABSL_ARRAYSIZE(trans), trans,
                                  scheduling_mode) == kOnceInit) {
    base_internal::invoke(std::forward<Callable>(fn),
                          std::forward<Args>(args)...);
    old_control =
        control->exchange(base_internal::kOnceDone, std::memory_order_release);
    if (old_control == base_internal::kOnceWaiter) {
      base_internal::SpinLockWake(control, true);
    }
  }  // else *control is already kOnceDone
}